

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_caster_base.h
# Opt level: O3

type_info * pybind11::detail::get_type_info(type_index *tp,bool throw_if_missing)

{
  int iVar1;
  iterator iVar2;
  internals *this;
  type_info *ptVar3;
  local_internals *this_00;
  string tname;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_78;
  string local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if (get_local_internals()::locals == '\0') {
    iVar1 = __cxa_guard_acquire(&get_local_internals()::locals);
    if (iVar1 != 0) {
      this_00 = (local_internals *)operator_new(0x48);
      local_internals::local_internals(this_00);
      get_local_internals()::locals = this_00;
      __cxa_guard_release(&get_local_internals()::locals);
    }
  }
  iVar2 = std::
          _Hashtable<std::type_index,_std::pair<const_std::type_index,_pybind11::detail::type_info_*>,_std::allocator<std::pair<const_std::type_index,_pybind11::detail::type_info_*>_>,_std::__detail::_Select1st,_std::equal_to<std::type_index>,_std::hash<std::type_index>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find((_Hashtable<std::type_index,_std::pair<const_std::type_index,_pybind11::detail::type_info_*>,_std::allocator<std::pair<const_std::type_index,_pybind11::detail::type_info_*>_>,_std::__detail::_Select1st,_std::equal_to<std::type_index>,_std::hash<std::type_index>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  *)get_local_internals()::locals,tp);
  if ((iVar2.
       super__Node_iterator_base<std::pair<const_std::type_index,_pybind11::detail::type_info_*>,_false>
       ._M_cur == (__node_type *)0x0) ||
     (ptVar3 = *(type_info **)
                ((long)iVar2.
                       super__Node_iterator_base<std::pair<const_std::type_index,_pybind11::detail::type_info_*>,_false>
                       ._M_cur + 0x10), ptVar3 == (type_info *)0x0)) {
    this = get_internals();
    iVar2 = std::
            _Hashtable<std::type_index,_std::pair<const_std::type_index,_pybind11::detail::type_info_*>,_std::allocator<std::pair<const_std::type_index,_pybind11::detail::type_info_*>_>,_std::__detail::_Select1st,_std::equal_to<std::type_index>,_std::hash<std::type_index>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find((_Hashtable<std::type_index,_std::pair<const_std::type_index,_pybind11::detail::type_info_*>,_std::allocator<std::pair<const_std::type_index,_pybind11::detail::type_info_*>_>,_std::__detail::_Select1st,_std::equal_to<std::type_index>,_std::hash<std::type_index>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                    *)this,tp);
    if (iVar2.
        super__Node_iterator_base<std::pair<const_std::type_index,_pybind11::detail::type_info_*>,_false>
        ._M_cur == (__node_type *)0x0) {
      ptVar3 = (type_info *)0x0;
    }
    else {
      ptVar3 = *(type_info **)
                ((long)iVar2.
                       super__Node_iterator_base<std::pair<const_std::type_index,_pybind11::detail::type_info_*>,_false>
                       ._M_cur + 0x10);
    }
    if (throw_if_missing && ptVar3 == (type_info *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_58,
                 *(char **)(tp->_M_target + 8) + (**(char **)(tp->_M_target + 8) == '*'),
                 (allocator<char> *)&bStack_78);
      clean_type_id(&local_58);
      std::operator+(&local_38,"pybind11::detail::get_type_info: unable to find type info for \"",
                     &local_58);
      std::operator+(&bStack_78,&local_38,'\"');
      pybind11_fail(&bStack_78);
    }
  }
  return ptVar3;
}

Assistant:

PYBIND11_NOINLINE detail::type_info *get_type_info(const std::type_index &tp,
                                                   bool throw_if_missing = false) {
    if (auto *ltype = get_local_type_info(tp)) {
        return ltype;
    }
    if (auto *gtype = get_global_type_info(tp)) {
        return gtype;
    }

    if (throw_if_missing) {
        std::string tname = tp.name();
        detail::clean_type_id(tname);
        pybind11_fail("pybind11::detail::get_type_info: unable to find type info for \""
                      + std::move(tname) + '"');
    }
    return nullptr;
}